

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O3

QDate __thiscall QDate::addYears(QDate *this,int nyears,QCalendar cal)

{
  bool bVar1;
  QDate QVar2;
  ulong uVar3;
  uint year;
  long in_FS_OFFSET;
  YearMonthDay YVar4;
  QCalendar local_58;
  QCalendar local_50;
  YearMonthDay local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar2.jd = -0x8000000000000000;
  local_58.d_ptr = cal.d_ptr;
  if (0x16d3e147973 < this->jd + 0xb69eeff91fU) goto LAB_00345e43;
  YVar4 = QCalendar::partsFromDate(&local_58,(QDate)this->jd);
  uVar3 = YVar4._0_8_ & 0xffffffff00000000;
  if (uVar3 == 0x8000000000000000) goto LAB_00345e43;
  year = YVar4.year + nyears;
  bVar1 = QCalendar::hasYearZero(&local_58);
  if (!bVar1) {
    if ((year == 0) || (0 < YVar4.year == (int)year < 1)) {
      year = (year + (uint)(0 < nyears) * 2) - 1;
    }
  }
  local_48._0_8_ = uVar3 | year;
  local_50.d_ptr = local_58.d_ptr;
  if ((int)year < 0) {
    bVar1 = QCalendar::isProleptic(&local_50);
LAB_00345e10:
    if (bVar1 == false) goto LAB_00345e43;
  }
  else if (year == 0) {
    bVar1 = QCalendar::hasYearZero(&local_50);
    goto LAB_00345e10;
  }
  local_48.day = QCalendar::daysInMonth(&local_50,YVar4.month,year);
  if (YVar4.day < local_48.day) {
    local_48.day = YVar4.day;
  }
  QVar2 = QCalendar::dateFromParts(&local_50,&local_48);
LAB_00345e43:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDate)QVar2.jd;
  }
  __stack_chk_fail();
}

Assistant:

QDate QDate::addYears(int nyears, QCalendar cal) const
{
    if (!isValid())
        return QDate();

    auto parts = cal.partsFromDate(*this);
    if (!parts.isValid())
        return QDate();

    int old_y = parts.year;
    parts.year += nyears;

    // If we just crossed (or hit) a missing year zero, adjust year by ±1:
    if (!cal.hasYearZero() && ((old_y > 0) != (parts.year > 0) || !parts.year))
        parts.year += nyears > 0 ? +1 : -1;

    return fixedDate(parts, cal);
}